

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

void __thiscall duckdb::Binder::AddBoundView(Binder *this,ViewCatalogEntry *view)

{
  pointer pcVar1;
  __node_base_ptr p_Var2;
  BinderException *this_00;
  __hashtable *__h;
  element_type *peVar3;
  __hash_code __code;
  __node_gen_type __node_gen;
  undefined1 local_70 [32];
  ViewCatalogEntry *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  peVar3 = this;
  while( true ) {
    local_70._0_8_ = view;
    p_Var2 = ::std::
             _Hashtable<std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::reference_wrapper<duckdb::ViewCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::ViewCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::ViewCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::_M_find_before_node
                       (&(peVar3->bound_views)._M_h,
                        (ulong)view % (peVar3->bound_views)._M_h._M_bucket_count,
                        (key_type *)local_70,(__hash_code)view);
    if ((p_Var2 != (__node_base_ptr)0x0) && (p_Var2->_M_nxt != (_Hash_node_base *)0x0)) break;
    peVar3 = (peVar3->parent).internal.
             super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      local_70._0_8_ = &this->bound_views;
      local_50 = view;
      ::std::
      _Hashtable<std::reference_wrapper<duckdb::ViewCatalogEntry>,std::reference_wrapper<duckdb::ViewCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::ViewCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::ViewCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::reference_wrapper<duckdb::ViewCatalogEntry>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::reference_wrapper<duckdb::ViewCatalogEntry>,true>>>>
                ((_Hashtable<std::reference_wrapper<duckdb::ViewCatalogEntry>,std::reference_wrapper<duckdb::ViewCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::ViewCatalogEntry>>,std::__detail::_Identity,duckdb::ReferenceEquality<duckdb::ViewCatalogEntry>,duckdb::ReferenceHashFunction<duckdb::ViewCatalogEntry>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_70._0_8_);
      return;
    }
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_70._0_8_ = local_70 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,
             "infinite recursion detected: attempting to recursively bind view \"%s\"","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  pcVar1 = (view->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name._M_dataplus._M_p
  ;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,
             pcVar1 + (view->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                      _M_string_length);
  BinderException::BinderException<std::__cxx11::string>(this_00,(string *)local_70,&local_48);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::AddBoundView(ViewCatalogEntry &view) {
	// check if the view is already bound
	auto current = this;
	while (current) {
		if (current->bound_views.find(view) != current->bound_views.end()) {
			throw BinderException("infinite recursion detected: attempting to recursively bind view \"%s\"", view.name);
		}
		current = current->parent.get();
	}
	bound_views.insert(view);
}